

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_> *
libtorrent::anon_unknown_91::default_plugins
          (vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           *__return_storage_ptr__,bool empty)

{
  undefined7 in_register_00000031;
  long lVar1;
  initializer_list<std::shared_ptr<libtorrent::plugin>_> __l;
  allocator_type local_99;
  shared_ptr<libtorrent::plugin> local_98;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if ((int)CONCAT71(in_register_00000031,empty) == 0) {
    std::
    make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::shared_ptr<libtorrent::torrent_plugin>(&)(libtorrent::torrent_handle_const&,void*)>
              ((_func_shared_ptr<libtorrent::torrent_plugin>_torrent_handle_ptr_void_ptr *)&local_48
              );
    local_98.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    local_98.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_40[0]._M_pi;
    local_48 = (element_type *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::shared_ptr<libtorrent::torrent_plugin>(&)(libtorrent::torrent_handle_const&,void*)>
              ((_func_shared_ptr<libtorrent::torrent_plugin>_torrent_handle_ptr_void_ptr *)&local_58
              );
    local_88 = local_58;
    p_Stack_80 = _Stack_50._M_pi;
    local_58 = 0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::shared_ptr<libtorrent::torrent_plugin>(&)(libtorrent::torrent_handle_const&,void*)>
              ((_func_shared_ptr<libtorrent::torrent_plugin>_torrent_handle_ptr_void_ptr *)&local_68
              );
    local_78 = local_68;
    p_Stack_70 = _Stack_60._M_pi;
    local_68 = 0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __l._M_len = 3;
    __l._M_array = &local_98;
    std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::vector(__return_storage_ptr__,__l,&local_99);
    lVar1 = 0x28;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_98.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar1));
      lVar1 = lVar1 + -0x10;
    } while (lVar1 != -8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<plugin>> default_plugins(
			bool empty = false)
		{
#ifndef TORRENT_DISABLE_EXTENSIONS
			if (empty) return {};
			using wrapper = aux::session_impl::session_plugin_wrapper;
			return {
				std::make_shared<wrapper>(create_ut_pex_plugin),
				std::make_shared<wrapper>(create_ut_metadata_plugin),
				std::make_shared<wrapper>(create_smart_ban_plugin)
			};
#else
			TORRENT_UNUSED(empty);
			return {};
#endif
		}